

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__encode_uint8_linear_scaled(void *outputp,int width_times_channels,float *encode)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 *puVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [12];
  float fVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  undefined1 auVar20 [16];
  float *pfVar21;
  uchar *output;
  undefined8 *puVar22;
  undefined8 *puVar23;
  undefined8 *puVar24;
  float *pfVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  auVar20 = _DAT_005ecd50;
  puVar3 = (undefined8 *)((long)outputp + (long)width_times_channels);
  fVar26 = (float)DAT_005ecd50;
  fVar27 = DAT_005ecd50._4_4_;
  fVar28 = DAT_005ecd50._8_4_;
  fVar29 = DAT_005ecd50._12_4_;
  if (width_times_channels < 8) {
    puVar22 = (undefined8 *)outputp;
    if (3 < width_times_channels) {
      do {
        auVar31._0_4_ = *encode * fVar26 + 0.5;
        auVar31._4_4_ = encode[1] * fVar27 + 0.5;
        auVar31._8_4_ = encode[2] * fVar28 + 0.5;
        auVar31._12_4_ = encode[3] * fVar29 + 0.5;
        auVar31 = minps(auVar31,auVar20);
        auVar31 = maxps(auVar31,ZEXT816(0));
        auVar34._0_4_ = (int)auVar31._0_4_;
        auVar34._4_4_ = (int)auVar31._4_4_;
        auVar34._8_4_ = (int)auVar31._8_4_;
        auVar34._12_4_ = (int)auVar31._12_4_;
        auVar31 = packssdw(auVar34,auVar34);
        sVar4 = auVar31._0_2_;
        sVar5 = auVar31._2_2_;
        sVar6 = auVar31._4_2_;
        sVar7 = auVar31._6_2_;
        *(uint *)puVar22 =
             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar31[6] - (0xff < sVar7),
                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar31[4] - (0xff < sVar6),
                               CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar31[2] - (0xff < sVar5),
                                        (0 < sVar4) * (sVar4 < 0x100) * auVar31[0] - (0xff < sVar4))
                              ));
        encode = encode + 4;
        outputp = (void *)((long)puVar22 + 4);
        puVar23 = puVar22 + 1;
        puVar22 = (undefined8 *)outputp;
      } while (puVar23 <= puVar3);
    }
    auVar20 = _DAT_005ecd50;
    if (outputp < puVar3) {
      do {
        auVar12._4_8_ = in_XMM6._8_8_;
        auVar12._0_4_ = 0x3f000000;
        auVar36._0_8_ = auVar12._0_8_ << 0x20;
        auVar36._8_4_ = 0x3f000000;
        auVar36._12_4_ = 0x3f000000;
        auVar37._4_12_ = auVar36._4_12_;
        auVar37._0_4_ = *encode * 255.0 + 0.5;
        auVar31 = minps(auVar37,auVar20);
        in_XMM6 = maxps(auVar31,ZEXT816(0));
        *(char *)outputp = (char)(int)in_XMM6._0_4_;
        outputp = (void *)((long)outputp + 1);
        encode = encode + 1;
      } while (outputp < puVar3);
    }
  }
  else {
    pfVar21 = encode + (long)width_times_channels + -8;
    puVar22 = puVar3 + -1;
    do {
      pfVar1 = encode + 8;
      puVar23 = (undefined8 *)((long)outputp + 8);
      puVar24 = puVar22;
      if (puVar23 == puVar3) {
        puVar24 = puVar23;
      }
      fVar13 = *encode;
      pfVar14 = encode + 1;
      pfVar15 = encode + 2;
      pfVar16 = encode + 3;
      pfVar25 = pfVar21;
      if (puVar23 == puVar3) {
        pfVar25 = pfVar1;
      }
      if (puVar23 <= puVar22) {
        puVar24 = puVar23;
      }
      pfVar2 = encode + 4;
      pfVar17 = encode + 5;
      pfVar18 = encode + 6;
      pfVar19 = encode + 7;
      encode = pfVar25;
      if (puVar23 <= puVar22) {
        encode = pfVar1;
      }
      auVar30._0_4_ = fVar13 * fVar26 + 0.5;
      auVar30._4_4_ = *pfVar14 * fVar27 + 0.5;
      auVar30._8_4_ = *pfVar15 * fVar28 + 0.5;
      auVar30._12_4_ = *pfVar16 * fVar29 + 0.5;
      auVar33._0_4_ = *pfVar2 * fVar26 + 0.5;
      auVar33._4_4_ = *pfVar17 * fVar27 + 0.5;
      auVar33._8_4_ = *pfVar18 * fVar28 + 0.5;
      auVar33._12_4_ = *pfVar19 * fVar29 + 0.5;
      auVar31 = minps(auVar30,auVar20);
      auVar34 = minps(auVar33,auVar20);
      auVar31 = maxps(auVar31,ZEXT816(0));
      auVar34 = maxps(auVar34,ZEXT816(0));
      auVar32._0_4_ = (int)auVar31._0_4_;
      auVar32._4_4_ = (int)auVar31._4_4_;
      auVar32._8_4_ = (int)auVar31._8_4_;
      auVar32._12_4_ = (int)auVar31._12_4_;
      auVar35._0_4_ = (int)auVar34._0_4_;
      auVar35._4_4_ = (int)auVar34._4_4_;
      auVar35._8_4_ = (int)auVar34._8_4_;
      auVar35._12_4_ = (int)auVar34._12_4_;
      auVar31 = packssdw(auVar32,auVar35);
      sVar4 = auVar31._0_2_;
      sVar5 = auVar31._2_2_;
      sVar6 = auVar31._4_2_;
      sVar7 = auVar31._6_2_;
      sVar8 = auVar31._8_2_;
      sVar9 = auVar31._10_2_;
      sVar10 = auVar31._12_2_;
      sVar11 = auVar31._14_2_;
      *(ulong *)outputp =
           CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar31[0xe] - (0xff < sVar11),
                    CONCAT16((0 < sVar10) * (sVar10 < 0x100) * auVar31[0xc] - (0xff < sVar10),
                             CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar31[10] - (0xff < sVar9),
                                      CONCAT14((0 < sVar8) * (sVar8 < 0x100) * auVar31[8] -
                                               (0xff < sVar8),
                                               CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar31[6] -
                                                        (0xff < sVar7),
                                                        CONCAT12((0 < sVar6) * (sVar6 < 0x100) *
                                                                 auVar31[4] - (0xff < sVar6),
                                                                 CONCAT11((0 < sVar5) *
                                                                          (sVar5 < 0x100) *
                                                                          auVar31[2] -
                                                                          (0xff < sVar5),
                                                                          (0 < sVar4) *
                                                                          (sVar4 < 0x100) *
                                                                          auVar31[0] -
                                                                          (0xff < sVar4))))))));
      outputp = puVar24;
    } while (puVar23 != puVar3);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_linear_scaled )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char *) outputp;
  unsigned char * end_output = ( (unsigned char *) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= stbir__simdfX_float_count*2 )
  {
    float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
    end_output -= stbir__simdfX_float_count*2;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdfX e0, e1;
      stbir__simdi i;
      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdfX_madd_mem( e0, STBIR_simd_point5X, STBIR_max_uint8_as_floatX, encode );
      stbir__simdfX_madd_mem( e1, STBIR_simd_point5X, STBIR_max_uint8_as_floatX, encode+stbir__simdfX_float_count );
      stbir__encode_simdfX_unflip( e0 );
      stbir__encode_simdfX_unflip( e1 );
      #ifdef STBIR_SIMD8
      stbir__simdf8_pack_to_16bytes( i, e0, e1 );
      stbir__simdi_store( output, i );
      #else
      stbir__simdf_pack_to_8bytes( i, e0, e1 );
      stbir__simdi_store2( output, i );
      #endif
      encode += stbir__simdfX_float_count*2;
      output += stbir__simdfX_float_count*2;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e0;
    stbir__simdi i0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e0, encode );
    stbir__simdf_madd( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), e0 );
    stbir__encode_simdf4_unflip( e0 );
    stbir__simdf_pack_to_8bytes( i0, e0, e0 );  // only use first 4
    *(int*)(output-4) = stbir__simdi_to_int( i0 );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    stbir__simdf e0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order0 ); output[0] = stbir__simdf_convert_float_to_uint8( e0 );
    #if stbir__coder_min_num >= 2
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order1 ); output[1] = stbir__simdf_convert_float_to_uint8( e0 );
    #endif
    #if stbir__coder_min_num >= 3
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order2 ); output[2] = stbir__simdf_convert_float_to_uint8( e0 );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  while( output <= end_output )
  {
    float f;
    f = encode[stbir__encode_order0] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[0-4] = (unsigned char)f;
    f = encode[stbir__encode_order1] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[1-4] = (unsigned char)f;
    f = encode[stbir__encode_order2] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[2-4] = (unsigned char)f;
    f = encode[stbir__encode_order3] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[3-4] = (unsigned char)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[0] = (unsigned char)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[1] = (unsigned char)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[2] = (unsigned char)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
  #endif
}